

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O0

void __thiscall pbrt::SDFace::SDFace(SDFace *this)

{
  int i_1;
  int i;
  SDFace *this_local;
  
  for (i = 0; i < 3; i = i + 1) {
    this->v[i] = (SDVertex *)0x0;
    this->f[i] = (SDFace *)0x0;
  }
  for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
    this->children[i_1] = (SDFace *)0x0;
  }
  return;
}

Assistant:

SDFace() {
        for (int i = 0; i < 3; ++i) {
            v[i] = nullptr;
            f[i] = nullptr;
        }
        for (int i = 0; i < 4; ++i)
            children[i] = nullptr;
    }